

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFormat.h
# Opt level: O0

FileFormat InferFileFormat(string *filepath,FileFormat defaultFormat)

{
  bool bVar1;
  __type _Var2;
  reference ppVar3;
  reference __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ending;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  pair<const_FileFormat,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ff;
  const_iterator __end1;
  const_iterator __begin1;
  map<FileFormat,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<FileFormat>,_std::allocator<std::pair<const_FileFormat,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ext;
  size_type pos;
  FileFormat defaultFormat_local;
  string *filepath_local;
  
  ext.field_2._8_8_ = std::__cxx11::string::find_last_of((char *)filepath,0x2d85b1);
  filepath_local._4_4_ = defaultFormat;
  if (ext.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)&__range1,(ulong)filepath);
    __end1 = std::
             map<FileFormat,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<FileFormat>,_std::allocator<std::pair<const_FileFormat,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::begin(&FileFormatEndings_abi_cxx11_);
    ff = (pair<const_FileFormat,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)std::
            map<FileFormat,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<FileFormat>,_std::allocator<std::pair<const_FileFormat,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::end(&FileFormatEndings_abi_cxx11_);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&ff), bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_FileFormat,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end1);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&ppVar3->second);
      ending = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&ppVar3->second);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&ending), bVar1) {
        __rhs = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&__range1,__rhs);
        if (_Var2) {
          filepath_local._4_4_ = ppVar3->first;
          goto LAB_00280914;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_FileFormat,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end1);
    }
LAB_00280914:
    std::__cxx11::string::~string((string *)&__range1);
  }
  return filepath_local._4_4_;
}

Assistant:

static FileFormat InferFileFormat( const std::string& filepath, const FileFormat defaultFormat ) {
  auto pos = filepath.find_last_of( "." );
  if( pos == std::string::npos )
    return defaultFormat;

  auto ext = filepath.substr( pos + 1 );
  for( auto &ff : FileFormatEndings ) {
    for( auto &ending : ff.second ) {
      if( ext == ending )
        return ff.first;
    }
  }
  return defaultFormat;
}